

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O2

Result wabt::ValidateFuncSignatures(Module *module,Errors *errors,ValidateOptions *options)

{
  Result *this;
  bool bVar1;
  reference base;
  FuncModuleField *pFVar2;
  const_iterator rhs;
  ExprVisitor local_150;
  undefined1 local_100 [8];
  Validator validator;
  const_iterator __begin2;
  CheckFuncSignatureExprVisitorDelegate delegate;
  
  anon_unknown_7::Validator::Validator((Validator *)local_100,errors,(Script *)0x0,options);
  __begin2.list_ = (intrusive_list<wabt::ModuleField> *)(module->fields).first_;
  this = &validator.result_;
  validator.script_ = (Script *)module;
  validator._168_8_ = &module->fields;
  while( true ) {
    rhs.node_ = (ModuleField *)0x0;
    rhs.list_ = &module->fields;
    bVar1 = intrusive_list<wabt::ModuleField>::const_iterator::operator!=
                      ((const_iterator *)this,rhs);
    if (!bVar1) break;
    base = intrusive_list<wabt::ModuleField>::const_iterator::operator*((const_iterator *)this);
    if (base->type_ == Func) {
      pFVar2 = cast<wabt::FuncModuleField,wabt::ModuleField>(base);
      anon_unknown_7::Validator::CheckFuncSignature
                ((Validator *)local_100,&base->loc,&(pFVar2->func).decl);
      __begin2.node_ = (ModuleField *)&PTR__Delegate_013e3c28;
      ExprVisitor::ExprVisitor(&local_150,(Delegate *)&__begin2.node_);
      ExprVisitor::VisitFunc(&local_150,&pFVar2->func);
      ExprVisitor::~ExprVisitor(&local_150);
    }
    intrusive_list<wabt::ModuleField>::const_iterator::operator++((const_iterator *)this);
  }
  anon_unknown_7::Validator::~Validator((Validator *)local_100);
  return (Result)(Enum)validator.expr_loc_;
}

Assistant:

Result ValidateFuncSignatures(const Module* module,
                              Errors* errors,
                              const ValidateOptions& options) {
  Validator validator(errors, nullptr, options);

  return validator.CheckAllFuncSignatures(module);
}